

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_des3.c
# Opt level: O0

int des_ede3_wrap_cipher(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  ulong in_RCX;
  char *in_RDX;
  void *in_RSI;
  EVP_CIPHER_CTX *in_RDI;
  uchar *in_stack_00000020;
  EVP_CIPHER_CTX *in_stack_00000028;
  int line;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if ((in_RCX < 0x4000000000000000) && ((in_RCX & 7) == 0)) {
    iVar1 = ossl_is_partially_overlapping(in_RSI,in_RDX,(int)in_RCX);
    line = (int)((ulong)in_RSI >> 0x20);
    if (iVar1 == 0) {
      iVar1 = EVP_CIPHER_CTX_is_encrypting(in_RDI);
      if (iVar1 == 0) {
        iVar1 = des_ede3_unwrap(in_stack_00000028,in_stack_00000020,(uchar *)ctx,(size_t)out);
      }
      else {
        iVar1 = des_ede3_wrap((EVP_CIPHER_CTX *)in,(uchar *)inl,
                              (uchar *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                              ,(size_t)in_RDI);
      }
    }
    else {
      ERR_new();
      ERR_set_debug((char *)in_RDI,line,in_RDX);
      ERR_set_error(6,0xa2,(char *)0x0);
      iVar1 = 0;
    }
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int des_ede3_wrap_cipher(EVP_CIPHER_CTX *ctx, unsigned char *out,
                                const unsigned char *in, size_t inl)
{
    /*
     * Sanity check input length: we typically only wrap keys so EVP_MAXCHUNK
     * is more than will ever be needed. Also input length must be a multiple
     * of 8 bits.
     */
    if (inl >= EVP_MAXCHUNK || inl % 8)
        return -1;

    if (ossl_is_partially_overlapping(out, in, inl)) {
        ERR_raise(ERR_LIB_EVP, EVP_R_PARTIALLY_OVERLAPPING);
        return 0;
    }

    if (EVP_CIPHER_CTX_is_encrypting(ctx))
        return des_ede3_wrap(ctx, out, in, inl);
    else
        return des_ede3_unwrap(ctx, out, in, inl);
}